

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandNum_Generator.cc
# Opt level: O2

long __thiscall RandNum_Generator::generator(RandNum_Generator *this,int x,int i,int m)

{
  ostream *poVar1;
  char *pcVar2;
  double dVar3;
  
  if (x < 0) {
    pcVar2 = "y must be a non-negative integer!";
  }
  else {
    if ((uint)i < 0x100) {
      if (m < 1) {
        poVar1 = std::operator<<((ostream *)&std::cerr,"m must be a positive integer!");
        std::endl<char,std::char_traits<char>>(poVar1);
      }
      dVar3 = floor((double)x * 0.00390625);
      return SUB168(ZEXT416(V[1][((int)dVar3 + i) % 0x100] ^ V[0][(byte)((char)i + (char)x)]) %
                    SEXT816((long)m),0);
    }
    pcVar2 = "i must be a non-negative integer less than 256!";
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  return -1;
}

Assistant:

long RandNum_Generator::generator(int x, int i, int m)
{

	long r = 0;
	//cout << "RandNum_Generator::generator" << endl;

	// y is a non-negative integer
	if (x < 0)
	{
		cerr << "y must be a non-negative integer!" << endl;
		return -1;
	}

	if ((i < 0) || (i >= 256 ))
	{
		cerr << "i must be a non-negative integer less than 256!" << endl;
		return -1;
	}

	if (m <= 0)
	{
		cerr << "m must be a positive integer!" << endl;
	}

	//cout << V[0][0] << endl;


	//mod 2^^8 = mod 256


	r = (V[0][(x + i) % 256] ^ V[1][((int)floor((double)x / 256.0) + i) % 256]);
	r =  r % m;

	return r;
}